

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCyclic.cpp
# Opt level: O1

void __thiscall SimpleCyclic::Cyclic::~Cyclic(Cyclic *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"N12SimpleCyclic6CyclicE",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"::",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"~Cyclic",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  p_Var2 = (this->_fn).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->_fn,(_Any_data *)&this->_fn,__destroy_functor);
  }
  p_Var3 = (this->super_enable_shared_from_this<SimpleCyclic::Cyclic>)._M_weak_this.
           super___weak_ptr<SimpleCyclic::Cyclic,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Cyclic::~Cyclic()
{
    std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
}